

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bqm.hpp
# Opt level: O3

void BQMTester<cimod::Sparse>::test_DenseConstructionTest_ConstructionMatrix(void)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  double dVar3;
  __node_base *p_Var4;
  char *pcVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Matrix int_mat;
  Matrix m;
  BQM<std::string,_double,_cimod::Sparse> bqm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  AssertHelper AStack_368;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_360;
  undefined1 local_358 [8];
  variable_if_dynamic<long,__1> vStack_350;
  variable_if_dynamic<long,__1> local_348;
  variable_if_dynamic<long,__1> vStack_340;
  StorageIndex *local_338;
  CompressedStorage<double,_int> local_330;
  double *local_308;
  long local_300;
  long local_2f8;
  void *local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [32];
  StorageIndex *local_b8;
  undefined1 local_b0 [24];
  pointer *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  local_d8._0_8_ = (pointer)0x5;
  local_d8._8_8_ = 5;
  local_d8._16_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_2f0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              *)local_d8);
  if ((0 < (long)local_2e8) && (1 < (long)local_2e0)) {
    *(undefined8 *)((long)local_2f0 + 8) = 0x3ff0000000000000;
    if ((local_2e0 != 2) &&
       (((*(undefined8 *)((long)local_2f0 + 0x10) = 0x4000000000000000, 3 < local_2e0 &&
         (*(undefined1 **)((long)local_2f0 + 0x18) = &DAT_4008000000000000, local_2e0 != 4)) &&
        (*(undefined8 *)((long)local_2f0 + 0x20) = 0x4010000000000000, local_2e8 != 1)))) {
      *(undefined8 *)((long)local_2f0 + local_2e0 * 8) = 0x4014000000000000;
      puVar1 = (undefined8 *)((long)local_2f0 + local_2e0 * 8 + 0x10);
      *puVar1 = 0x4018000000000000;
      puVar1[1] = 0x401c000000000000;
      *(undefined8 *)((long)local_2f0 + local_2e0 * 8 + 0x20) = 0x4020000000000000;
      if (2 < local_2e8) {
        puVar1 = (undefined8 *)((long)local_2f0 + local_2e0 * 0x10);
        *puVar1 = 0x4022000000000000;
        puVar1[1] = 0x4024000000000000;
        puVar1 = (undefined8 *)((long)local_2f0 + local_2e0 * 0x10 + 0x18);
        *puVar1 = 0x4026000000000000;
        puVar1[1] = 0x4028000000000000;
        if (local_2e8 != 3) {
          puVar1 = (undefined8 *)((long)local_2f0 + local_2e0 * 0x18);
          *puVar1 = 0x402a000000000000;
          puVar1[1] = 0x402c000000000000;
          *(undefined8 *)((long)local_2f0 + local_2e0 * 0x18 + 0x10) = 0x402e000000000000;
          *(undefined8 *)((long)local_2f0 + local_2e0 * 0x18 + 0x20) = 0x4030000000000000;
          if (4 < local_2e8) {
            puVar1 = (undefined8 *)((long)local_2f0 + local_2e0 * 0x20);
            *puVar1 = 0x4031000000000000;
            puVar1[1] = 0x4032000000000000;
            puVar2 = (undefined4 *)((long)local_2f0 + local_2e0 * 0x20 + 0x10);
            *puVar2 = 0;
            puVar2[1] = 0x40330000;
            puVar2[2] = 0;
            puVar2[3] = 0x40340000;
            local_d8._0_8_ = local_d8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"a","");
            local_b8 = (StorageIndex *)(local_b0 + 8);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"b","");
            local_98 = &local_90.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"d","");
            p_Var4 = &local_78._M_before_begin;
            local_78._M_buckets = &p_Var4->_M_nxt;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"e","");
            __l._M_len = 4;
            __l._M_array = (iterator)local_d8;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_30,__l,(allocator_type *)local_358);
            lVar6 = -0x80;
            do {
              if (p_Var4 != (__node_base *)
                            ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)(p_Var4 + -2))->_M_buckets) {
                operator_delete(((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                  *)(p_Var4 + -2))->_M_buckets,
                                (ulong)((long)&p_Var4->_M_nxt->_M_nxt + 1));
              }
              p_Var4 = p_Var4 + -4;
              lVar6 = lVar6 + 0x20;
            } while (lVar6 != 0);
            local_348.m_value = 0;
            vStack_340.m_value = 0;
            local_358 = (undefined1  [8])0x0;
            vStack_350.m_value = 0;
            local_330.m_values = (double *)0x0;
            local_330.m_indices = (StorageIndex *)0x0;
            local_330.m_size = 0;
            Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
            construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                      ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                       local_358,&local_2f0);
            local_308 = (double *)0x0;
            cimod::
            BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
            ::BinaryQuadraticModel
                      ((BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                        *)local_d8,
                       (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                        *)local_358,&local_30,(double *)&local_308,SPIN,true);
            free(local_330.m_values);
            Eigen::SparseMatrix<double,_1,_int>::SparseMatrix
                      ((SparseMatrix<double,_1,_int> *)local_358,
                       (SparseMatrix<double,_1,_int> *)local_d8);
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
            PlainObjectBase<Eigen::SparseMatrix<double,1,int>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_308,
                       (EigenBase<Eigen::SparseMatrix<double,_1,_int>_> *)local_358);
            free((void *)vStack_340.m_value);
            free(local_338);
            Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_330);
            if ((0 < local_300) && (0 < local_2f8)) {
              testing::internal::CmpHelperFloatingPointEQ<double>
                        ((internal *)local_358,"int_mat(0,0)","0",*local_308,0.0);
              if (local_358[0] == false) {
                testing::Message::Message((Message *)&local_360);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    vStack_350.m_value ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = "";
                }
                else {
                  pcVar5 = *(char **)vStack_350.m_value;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_368,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                           ,0x9d,pcVar5);
                testing::internal::AssertHelper::operator=(&AStack_368,(Message *)&local_360);
                testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                if (local_360._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_360._M_head_impl + 8))();
                }
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  vStack_350.m_value !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&vStack_350,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             vStack_350.m_value);
              }
              if ((0 < local_300) && (1 < local_2f8)) {
                testing::internal::CmpHelperFloatingPointEQ<double>
                          ((internal *)local_358,"int_mat(0,1)","6",local_308[1],6.0);
                if (local_358[0] == false) {
                  testing::Message::Message((Message *)&local_360);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      vStack_350.m_value ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = *(char **)vStack_350.m_value;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_368,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                             ,0x9e,pcVar5);
                  testing::internal::AssertHelper::operator=(&AStack_368,(Message *)&local_360);
                  testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                  if (local_360._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_360._M_head_impl + 8))();
                  }
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    vStack_350.m_value !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&vStack_350,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               vStack_350.m_value);
                }
                if ((0 < local_300) && (2 < local_2f8)) {
                  testing::internal::CmpHelperFloatingPointEQ<double>
                            ((internal *)local_358,"int_mat(0,2)","11",local_308[2],11.0);
                  if (local_358[0] == false) {
                    testing::Message::Message((Message *)&local_360);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        vStack_350.m_value ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar5 = "";
                    }
                    else {
                      pcVar5 = *(char **)vStack_350.m_value;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&AStack_368,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                               ,0x9f,pcVar5);
                    testing::internal::AssertHelper::operator=(&AStack_368,(Message *)&local_360);
                    testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                    if (local_360._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_360._M_head_impl + 8))();
                    }
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      vStack_350.m_value !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&vStack_350,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)vStack_350.m_value);
                  }
                  if ((0 < local_300) && (3 < local_2f8)) {
                    testing::internal::CmpHelperFloatingPointEQ<double>
                              ((internal *)local_358,"int_mat(0,3)","16",local_308[3],16.0);
                    if (local_358[0] == false) {
                      testing::Message::Message((Message *)&local_360);
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          vStack_350.m_value ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar5 = "";
                      }
                      else {
                        pcVar5 = *(char **)vStack_350.m_value;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&AStack_368,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                 ,0xa0,pcVar5);
                      testing::internal::AssertHelper::operator=(&AStack_368,(Message *)&local_360);
                      testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                      if (local_360._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_360._M_head_impl + 8))();
                      }
                    }
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        vStack_350.m_value !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&vStack_350,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)vStack_350.m_value);
                    }
                    if ((0 < local_300) && (4 < local_2f8)) {
                      testing::internal::CmpHelperFloatingPointEQ<double>
                                ((internal *)local_358,"int_mat(0,4)","21",local_308[4],21.0);
                      if (local_358[0] == false) {
                        testing::Message::Message((Message *)&local_360);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            vStack_350.m_value ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar5 = "";
                        }
                        else {
                          pcVar5 = *(char **)vStack_350.m_value;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&AStack_368,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                   ,0xa1,pcVar5);
                        testing::internal::AssertHelper::operator=
                                  (&AStack_368,(Message *)&local_360);
                        testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                        if (local_360._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_360._M_head_impl + 8))();
                        }
                      }
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          vStack_350.m_value !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&vStack_350,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)vStack_350.m_value);
                      }
                      if ((1 < local_300) && (0 < local_2f8)) {
                        testing::internal::CmpHelperFloatingPointEQ<double>
                                  ((internal *)local_358,"int_mat(1,0)","0",local_308[local_2f8],0.0
                                  );
                        if (local_358[0] == false) {
                          testing::Message::Message((Message *)&local_360);
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              vStack_350.m_value ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar5 = "";
                          }
                          else {
                            pcVar5 = *(char **)vStack_350.m_value;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&AStack_368,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                     ,0xa2,pcVar5);
                          testing::internal::AssertHelper::operator=
                                    (&AStack_368,(Message *)&local_360);
                          testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                          if (local_360._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_360._M_head_impl + 8))();
                          }
                        }
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            vStack_350.m_value !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&vStack_350,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)vStack_350.m_value);
                        }
                        if ((1 < local_300) && (1 < local_2f8)) {
                          testing::internal::CmpHelperFloatingPointEQ<double>
                                    ((internal *)local_358,"int_mat(1,1)","0",
                                     local_308[local_2f8 + 1],0.0);
                          if (local_358[0] == false) {
                            testing::Message::Message((Message *)&local_360);
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vStack_350.m_value ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar5 = "";
                            }
                            else {
                              pcVar5 = *(char **)vStack_350.m_value;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&AStack_368,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                       ,0xa3,pcVar5);
                            testing::internal::AssertHelper::operator=
                                      (&AStack_368,(Message *)&local_360);
                            testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                            if (local_360._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_360._M_head_impl + 8))();
                            }
                          }
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              vStack_350.m_value !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&vStack_350,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)vStack_350.m_value);
                          }
                          if ((1 < local_300) && (2 < local_2f8)) {
                            testing::internal::CmpHelperFloatingPointEQ<double>
                                      ((internal *)local_358,"int_mat(1,2)","16",
                                       local_308[local_2f8 + 2],16.0);
                            if (local_358[0] == false) {
                              testing::Message::Message((Message *)&local_360);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)vStack_350.m_value ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar5 = "";
                              }
                              else {
                                pcVar5 = *(char **)vStack_350.m_value;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&AStack_368,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                         ,0xa4,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        (&AStack_368,(Message *)&local_360);
                              testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                              if (local_360._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_360._M_head_impl + 8))();
                              }
                            }
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vStack_350.m_value !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&vStack_350,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)vStack_350.m_value);
                            }
                            if ((1 < local_300) && (3 < local_2f8)) {
                              testing::internal::CmpHelperFloatingPointEQ<double>
                                        ((internal *)local_358,"int_mat(1,3)","21",
                                         local_308[local_2f8 + 3],21.0);
                              if (local_358[0] == false) {
                                testing::Message::Message((Message *)&local_360);
                                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)vStack_350.m_value ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar5 = "";
                                }
                                else {
                                  pcVar5 = *(char **)vStack_350.m_value;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&AStack_368,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                           ,0xa5,pcVar5);
                                testing::internal::AssertHelper::operator=
                                          (&AStack_368,(Message *)&local_360);
                                testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                                if (local_360._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_360._M_head_impl + 8))();
                                }
                              }
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)vStack_350.m_value !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&vStack_350,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)vStack_350.m_value);
                              }
                              if ((1 < local_300) && (4 < local_2f8)) {
                                testing::internal::CmpHelperFloatingPointEQ<double>
                                          ((internal *)local_358,"int_mat(1,4)","26",
                                           local_308[local_2f8 + 4],26.0);
                                if (local_358[0] == false) {
                                  testing::Message::Message((Message *)&local_360);
                                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)vStack_350.m_value ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar5 = "";
                                  }
                                  else {
                                    pcVar5 = *(char **)vStack_350.m_value;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&AStack_368,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                             ,0xa6,pcVar5);
                                  testing::internal::AssertHelper::operator=
                                            (&AStack_368,(Message *)&local_360);
                                  testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                                  if (local_360._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_360._M_head_impl + 8))();
                                  }
                                }
                                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)vStack_350.m_value !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&vStack_350,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)vStack_350.m_value);
                                }
                                if ((2 < local_300) && (0 < local_2f8)) {
                                  testing::internal::CmpHelperFloatingPointEQ<double>
                                            ((internal *)local_358,"int_mat(2,0)","0",
                                             local_308[local_2f8 * 2],0.0);
                                  if (local_358[0] == false) {
                                    testing::Message::Message((Message *)&local_360);
                                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)vStack_350.m_value ==
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      pcVar5 = "";
                                    }
                                    else {
                                      pcVar5 = *(char **)vStack_350.m_value;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&AStack_368,kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                               ,0xa7,pcVar5);
                                    testing::internal::AssertHelper::operator=
                                              (&AStack_368,(Message *)&local_360);
                                    testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                                    if (local_360._M_head_impl !=
                                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      (**(code **)(*(long *)local_360._M_head_impl + 8))();
                                    }
                                  }
                                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)vStack_350.m_value !=
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                  }
                                  if ((2 < local_300) && (1 < local_2f8)) {
                                    testing::internal::CmpHelperFloatingPointEQ<double>
                                              ((internal *)local_358,"int_mat(2,1)","0",
                                               local_308[local_2f8 * 2 + 1],0.0);
                                    if (local_358[0] == false) {
                                      testing::Message::Message((Message *)&local_360);
                                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)vStack_350.m_value ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar5 = "";
                                      }
                                      else {
                                        pcVar5 = *(char **)vStack_350.m_value;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&AStack_368,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                 ,0xa8,pcVar5);
                                      testing::internal::AssertHelper::operator=
                                                (&AStack_368,(Message *)&local_360);
                                      testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                                      if (local_360._M_head_impl !=
                                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        (**(code **)(*(long *)local_360._M_head_impl + 8))();
                                      }
                                    }
                                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)vStack_350.m_value !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                    }
                                    if ((2 < local_300) && (2 < local_2f8)) {
                                      testing::internal::CmpHelperFloatingPointEQ<double>
                                                ((internal *)local_358,"int_mat(2,2)","0",
                                                 local_308[local_2f8 * 2 + 2],0.0);
                                      if (local_358[0] == false) {
                                        testing::Message::Message((Message *)&local_360);
                                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)vStack_350.m_value ==
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          pcVar5 = "";
                                        }
                                        else {
                                          pcVar5 = *(char **)vStack_350.m_value;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&AStack_368,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xa9,pcVar5);
                                        testing::internal::AssertHelper::operator=
                                                  (&AStack_368,(Message *)&local_360);
                                        testing::internal::AssertHelper::~AssertHelper(&AStack_368);
                                        if (local_360._M_head_impl !=
                                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          (**(code **)(*(long *)local_360._M_head_impl + 8))();
                                        }
                                      }
                                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)vStack_350.m_value !=
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                      }
                                      if ((2 < local_300) && (3 < local_2f8)) {
                                        testing::internal::CmpHelperFloatingPointEQ<double>
                                                  ((internal *)local_358,"int_mat(2,3)","26",
                                                   local_308[local_2f8 * 2 + 3],26.0);
                                        if (local_358[0] == false) {
                                          testing::Message::Message((Message *)&local_360);
                                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)vStack_350.m_value ==
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            pcVar5 = "";
                                          }
                                          else {
                                            pcVar5 = *(char **)vStack_350.m_value;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&AStack_368,kNonFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xaa,pcVar5);
                                          testing::internal::AssertHelper::operator=
                                                    (&AStack_368,(Message *)&local_360);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    (&AStack_368);
                                          if (local_360._M_head_impl !=
                                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            (**(code **)(*(long *)local_360._M_head_impl + 8))();
                                          }
                                        }
                                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)vStack_350.m_value !=
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          std::
                                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                        }
                                        if ((2 < local_300) && (4 < local_2f8)) {
                                          testing::internal::CmpHelperFloatingPointEQ<double>
                                                    ((internal *)local_358,"int_mat(2,4)","31",
                                                     local_308[local_2f8 * 2 + 4],31.0);
                                          if (local_358[0] == false) {
                                            testing::Message::Message((Message *)&local_360);
                                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)vStack_350.m_value ==
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              pcVar5 = "";
                                            }
                                            else {
                                              pcVar5 = *(char **)vStack_350.m_value;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&AStack_368,kNonFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xab,pcVar5);
                                            testing::internal::AssertHelper::operator=
                                                      (&AStack_368,(Message *)&local_360);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&AStack_368);
                                            if (local_360._M_head_impl !=
                                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              (**(code **)(*(long *)local_360._M_head_impl + 8))();
                                            }
                                          }
                                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)vStack_350.m_value !=
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            std::
                                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                          }
                                          if ((3 < local_300) && (0 < local_2f8)) {
                                            testing::internal::CmpHelperFloatingPointEQ<double>
                                                      ((internal *)local_358,"int_mat(3,0)","0",
                                                       local_308[local_2f8 * 3],0.0);
                                            if (local_358[0] == false) {
                                              testing::Message::Message((Message *)&local_360);
                                              if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                pcVar5 = "";
                                              }
                                              else {
                                                pcVar5 = *(char **)vStack_350.m_value;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&AStack_368,kNonFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xac,pcVar5);
                                              testing::internal::AssertHelper::operator=
                                                        (&AStack_368,(Message *)&local_360);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&AStack_368);
                                              if (local_360._M_head_impl !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                (**(code **)(*(long *)local_360._M_head_impl + 8))()
                                                ;
                                              }
                                            }
                                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)vStack_350.m_value !=
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              std::
                                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                            }
                                            if ((3 < local_300) && (1 < local_2f8)) {
                                              testing::internal::CmpHelperFloatingPointEQ<double>
                                                        ((internal *)local_358,"int_mat(3,1)","0",
                                                         local_308[local_2f8 * 3 + 1],0.0);
                                              if (local_358[0] == false) {
                                                testing::Message::Message((Message *)&local_360);
                                                if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  pcVar5 = "";
                                                }
                                                else {
                                                  pcVar5 = *(char **)vStack_350.m_value;
                                                }
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&AStack_368,kNonFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xad,pcVar5);
                                                testing::internal::AssertHelper::operator=
                                                          (&AStack_368,(Message *)&local_360);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&AStack_368);
                                                if (local_360._M_head_impl !=
                                                    (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  (**(code **)(*(long *)local_360._M_head_impl + 8))
                                                            ();
                                                }
                                              }
                                              if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                std::
                                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                              }
                                              if ((3 < local_300) && (2 < local_2f8)) {
                                                testing::internal::CmpHelperFloatingPointEQ<double>
                                                          ((internal *)local_358,"int_mat(3,2)","0",
                                                           local_308[local_2f8 * 3 + 2],0.0);
                                                if (local_358[0] == false) {
                                                  testing::Message::Message((Message *)&local_360);
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xae,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                }
                                                if ((3 < local_300) && (3 < local_2f8)) {
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)local_358,"int_mat(3,3)",
                                                             "0",local_308[local_2f8 * 3 + 3],0.0);
                                                  if (local_358[0] == false) {
                                                    testing::Message::Message((Message *)&local_360)
                                                    ;
                                                    if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xaf,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  if ((3 < local_300) && (4 < local_2f8)) {
                                                    testing::internal::
                                                    CmpHelperFloatingPointEQ<double>
                                                              ((internal *)local_358,"int_mat(3,4)",
                                                               "36",local_308[local_2f8 * 3 + 4],
                                                               36.0);
                                                    if (local_358[0] == false) {
                                                      testing::Message::Message
                                                                ((Message *)&local_360);
                                                      if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xb0,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  if ((4 < local_300) && (0 < local_2f8)) {
                                                    testing::internal::
                                                    CmpHelperFloatingPointEQ<double>
                                                              ((internal *)local_358,"int_mat(4,0)",
                                                               "0",local_308[local_2f8 * 4],0.0);
                                                    if (local_358[0] == false) {
                                                      testing::Message::Message
                                                                ((Message *)&local_360);
                                                      if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xb1,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  if ((4 < local_300) && (1 < local_2f8)) {
                                                    testing::internal::
                                                    CmpHelperFloatingPointEQ<double>
                                                              ((internal *)local_358,"int_mat(4,1)",
                                                               "0",local_308[local_2f8 * 4 + 1],0.0)
                                                    ;
                                                    if (local_358[0] == false) {
                                                      testing::Message::Message
                                                                ((Message *)&local_360);
                                                      if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xb2,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  if ((4 < local_300) && (2 < local_2f8)) {
                                                    testing::internal::
                                                    CmpHelperFloatingPointEQ<double>
                                                              ((internal *)local_358,"int_mat(4,2)",
                                                               "0",local_308[local_2f8 * 4 + 2],0.0)
                                                    ;
                                                    if (local_358[0] == false) {
                                                      testing::Message::Message
                                                                ((Message *)&local_360);
                                                      if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xb3,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  if ((4 < local_300) && (3 < local_2f8)) {
                                                    testing::internal::
                                                    CmpHelperFloatingPointEQ<double>
                                                              ((internal *)local_358,"int_mat(4,3)",
                                                               "0",local_308[local_2f8 * 4 + 3],0.0)
                                                    ;
                                                    if (local_358[0] == false) {
                                                      testing::Message::Message
                                                                ((Message *)&local_360);
                                                      if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xb4,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  if ((4 < local_300) && (4 < local_2f8)) {
                                                    testing::internal::
                                                    CmpHelperFloatingPointEQ<double>
                                                              ((internal *)local_358,"int_mat(4,4)",
                                                               "1",local_308[local_2f8 * 4 + 4],1.0)
                                                    ;
                                                    if (local_358[0] == false) {
                                                      testing::Message::Message
                                                                ((Message *)&local_360);
                                                      if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xb5,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  local_f8._M_dataplus._M_p =
                                                       (pointer)&local_f8.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_f8,"a","");
                                                  local_118._M_dataplus._M_p =
                                                       (pointer)&local_118.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_118,"b","");
                                                  dVar3 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  *)local_d8,&local_f8,&local_118);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)local_358,
                                                             "bqm.get_quadratic(\"a\", \"b\")","6",
                                                             dVar3,6.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_118._M_dataplus._M_p != &local_118.field_2
                                                  ) {
                                                    operator_delete(local_118._M_dataplus._M_p,
                                                                    local_118.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_f8._M_dataplus._M_p != &local_f8.field_2)
                                                  {
                                                    operator_delete(local_f8._M_dataplus._M_p,
                                                                    local_f8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_358[0] == false) {
                                                    testing::Message::Message((Message *)&local_360)
                                                    ;
                                                    if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xb9,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  local_138._M_dataplus._M_p =
                                                       (pointer)&local_138.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_138,"a","");
                                                  local_158._M_dataplus._M_p =
                                                       (pointer)&local_158.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_158,"d","");
                                                  dVar3 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  *)local_d8,&local_138,&local_158);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)local_358,
                                                             "bqm.get_quadratic(\"a\", \"d\")","11",
                                                             dVar3,11.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_158._M_dataplus._M_p != &local_158.field_2
                                                  ) {
                                                    operator_delete(local_158._M_dataplus._M_p,
                                                                    local_158.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_138._M_dataplus._M_p != &local_138.field_2
                                                  ) {
                                                    operator_delete(local_138._M_dataplus._M_p,
                                                                    local_138.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_358[0] == false) {
                                                    testing::Message::Message((Message *)&local_360)
                                                    ;
                                                    if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xba,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  local_178._M_dataplus._M_p =
                                                       (pointer)&local_178.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_178,"a","");
                                                  local_198._M_dataplus._M_p =
                                                       (pointer)&local_198.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_198,"e","");
                                                  dVar3 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  *)local_d8,&local_178,&local_198);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)local_358,
                                                             "bqm.get_quadratic(\"a\", \"e\")","16",
                                                             dVar3,16.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_198._M_dataplus._M_p != &local_198.field_2
                                                  ) {
                                                    operator_delete(local_198._M_dataplus._M_p,
                                                                    local_198.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_178._M_dataplus._M_p != &local_178.field_2
                                                  ) {
                                                    operator_delete(local_178._M_dataplus._M_p,
                                                                    local_178.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_358[0] == false) {
                                                    testing::Message::Message((Message *)&local_360)
                                                    ;
                                                    if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xbb,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  local_1b8._M_dataplus._M_p =
                                                       (pointer)&local_1b8.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_1b8,"b","");
                                                  local_1d8._M_dataplus._M_p =
                                                       (pointer)&local_1d8.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_1d8,"d","");
                                                  dVar3 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  *)local_d8,&local_1b8,&local_1d8);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)local_358,
                                                             "bqm.get_quadratic(\"b\", \"d\")","16",
                                                             dVar3,16.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1d8._M_dataplus._M_p != &local_1d8.field_2
                                                  ) {
                                                    operator_delete(local_1d8._M_dataplus._M_p,
                                                                    local_1d8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1b8._M_dataplus._M_p != &local_1b8.field_2
                                                  ) {
                                                    operator_delete(local_1b8._M_dataplus._M_p,
                                                                    local_1b8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_358[0] == false) {
                                                    testing::Message::Message((Message *)&local_360)
                                                    ;
                                                    if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xbc,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  local_1f8._M_dataplus._M_p =
                                                       (pointer)&local_1f8.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_1f8,"b","");
                                                  local_218._M_dataplus._M_p =
                                                       (pointer)&local_218.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_218,"e","");
                                                  dVar3 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  *)local_d8,&local_1f8,&local_218);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)local_358,
                                                             "bqm.get_quadratic(\"b\", \"e\")","21",
                                                             dVar3,21.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_218._M_dataplus._M_p != &local_218.field_2
                                                  ) {
                                                    operator_delete(local_218._M_dataplus._M_p,
                                                                    local_218.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1f8._M_dataplus._M_p != &local_1f8.field_2
                                                  ) {
                                                    operator_delete(local_1f8._M_dataplus._M_p,
                                                                    local_1f8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_358[0] == false) {
                                                    testing::Message::Message((Message *)&local_360)
                                                    ;
                                                    if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xbd,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  local_238._M_dataplus._M_p =
                                                       (pointer)&local_238.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_238,"d","");
                                                  local_258._M_dataplus._M_p =
                                                       (pointer)&local_258.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_258,"e","");
                                                  dVar3 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  *)local_d8,&local_238,&local_258);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)local_358,
                                                             "bqm.get_quadratic(\"d\", \"e\")","26",
                                                             dVar3,26.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_258._M_dataplus._M_p != &local_258.field_2
                                                  ) {
                                                    operator_delete(local_258._M_dataplus._M_p,
                                                                    local_258.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_238._M_dataplus._M_p != &local_238.field_2
                                                  ) {
                                                    operator_delete(local_238._M_dataplus._M_p,
                                                                    local_238.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_358[0] == false) {
                                                    testing::Message::Message((Message *)&local_360)
                                                    ;
                                                    if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xbe,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  local_278._M_dataplus._M_p =
                                                       (pointer)&local_278.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_278,"a","");
                                                  dVar3 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  ::get_linear((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  *)local_d8,&local_278);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)local_358,
                                                             "bqm.get_linear(\"a\")","21",dVar3,21.0
                                                            );
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_278._M_dataplus._M_p != &local_278.field_2
                                                  ) {
                                                    operator_delete(local_278._M_dataplus._M_p,
                                                                    local_278.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_358[0] == false) {
                                                    testing::Message::Message((Message *)&local_360)
                                                    ;
                                                    if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xc0,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  local_298._M_dataplus._M_p =
                                                       (pointer)&local_298.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_298,"b","");
                                                  dVar3 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  ::get_linear((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  *)local_d8,&local_298);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)local_358,
                                                             "bqm.get_linear(\"b\")","26",dVar3,26.0
                                                            );
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_298._M_dataplus._M_p != &local_298.field_2
                                                  ) {
                                                    operator_delete(local_298._M_dataplus._M_p,
                                                                    local_298.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_358[0] == false) {
                                                    testing::Message::Message((Message *)&local_360)
                                                    ;
                                                    if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xc1,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  local_2b8._M_dataplus._M_p =
                                                       (pointer)&local_2b8.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_2b8,"d","");
                                                  dVar3 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  ::get_linear((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  *)local_d8,&local_2b8);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)local_358,
                                                             "bqm.get_linear(\"d\")","31",dVar3,31.0
                                                            );
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_2b8._M_dataplus._M_p != &local_2b8.field_2
                                                  ) {
                                                    operator_delete(local_2b8._M_dataplus._M_p,
                                                                    local_2b8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_358[0] == false) {
                                                    testing::Message::Message((Message *)&local_360)
                                                    ;
                                                    if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xc2,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  local_2d8._M_dataplus._M_p =
                                                       (pointer)&local_2d8.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_2d8,"e","");
                                                  dVar3 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  ::get_linear((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                                                  *)local_d8,&local_2d8);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)local_358,
                                                             "bqm.get_linear(\"e\")","36",dVar3,36.0
                                                            );
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_2d8._M_dataplus._M_p != &local_2d8.field_2
                                                  ) {
                                                    operator_delete(local_2d8._M_dataplus._M_p,
                                                                    local_2d8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_358[0] == false) {
                                                    testing::Message::Message((Message *)&local_360)
                                                    ;
                                                    if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = *(char **)vStack_350.m_value;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&AStack_368,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xc3,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&AStack_368,(Message *)&local_360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&AStack_368);
                                                  if (local_360._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_360._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&vStack_350,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)vStack_350.m_value);
                                                  }
                                                  free(local_308);
                                                  std::
                                                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                                  ::~_Hashtable(&local_78);
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector(&local_90);
                                                  free((void *)local_d8._24_8_);
                                                  free(local_b8);
                                                  Eigen::internal::CompressedStorage<double,_int>::
                                                  ~CompressedStorage((CompressedStorage<double,_int>
                                                                      *)local_b0);
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector(&local_30);
                                                  free(local_2f0);
                                                  return;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

static void test_DenseConstructionTest_ConstructionMatrix()
    {
        using Matrix = Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor>;
        Matrix m = Matrix::Zero(5,5);
        m(0,1) = 1;
        m(0,2) = 2;
        m(0,3) = 3;
        m(0,4) = 4;
        m(1,0) = 5;
        m(1,2) = 6;
        m(1,3) = 7;
        m(1,4) = 8;
        m(2,0) = 9;
        m(2,1) = 10;
        m(2,3) = 11;
        m(2,4) = 12;
        m(3,0) = 13;
        m(3,1) = 14;
        m(3,2) = 15;
        m(3,4) = 16;
        m(4,0) = 17;
        m(4,1) = 18;
        m(4,2) = 19;
        m(4,3) = 20;

        auto labels = std::vector<std::string>{"a", "b", "d", "e"};

        BQM<std::string, double, DataType> bqm(m, labels, 0.0, Vartype::SPIN);

        Matrix int_mat = bqm.interaction_matrix();
        EXPECT_DOUBLE_EQ(int_mat(0,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(0,1), 6);
        EXPECT_DOUBLE_EQ(int_mat(0,2), 11);
        EXPECT_DOUBLE_EQ(int_mat(0,3), 16);
        EXPECT_DOUBLE_EQ(int_mat(0,4), 21);
        EXPECT_DOUBLE_EQ(int_mat(1,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(1,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(1,2), 16);
        EXPECT_DOUBLE_EQ(int_mat(1,3), 21);
        EXPECT_DOUBLE_EQ(int_mat(1,4), 26);
        EXPECT_DOUBLE_EQ(int_mat(2,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(2,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(2,2), 0);
        EXPECT_DOUBLE_EQ(int_mat(2,3), 26);
        EXPECT_DOUBLE_EQ(int_mat(2,4), 31);
        EXPECT_DOUBLE_EQ(int_mat(3,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,2), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,3), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,4), 36);
        EXPECT_DOUBLE_EQ(int_mat(4,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,2), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,3), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,4), 1);

        //check elements

        EXPECT_DOUBLE_EQ(bqm.get_quadratic("a", "b"), 6);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("a", "d"), 11);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("a", "e"), 16);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("b", "d"), 16);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("b", "e"), 21);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("d", "e"), 26);

        EXPECT_DOUBLE_EQ(bqm.get_linear("a"), 21);
        EXPECT_DOUBLE_EQ(bqm.get_linear("b"), 26);
        EXPECT_DOUBLE_EQ(bqm.get_linear("d"), 31);
        EXPECT_DOUBLE_EQ(bqm.get_linear("e"), 36);
    }